

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,string *_name,string *_className,string *_description,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_tags,SourceLineInfo *_lineInfo)

{
  SpecialProperties SVar1;
  pointer pcVar2;
  SpecialProperties SVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  string lcaseTag;
  ostringstream oss;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar2 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + _name->_M_string_length);
  (this->className)._M_dataplus._M_p = (pointer)&(this->className).field_2;
  pcVar2 = (_className->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->className,pcVar2,pcVar2 + _className->_M_string_length);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar2 = (_description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar2,pcVar2 + _description->_M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->tags)._M_t,&_tags->_M_t);
  p_Var6 = &(this->lcaseTags)._M_t._M_impl.super__Rb_tree_header;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->tagsAsString)._M_dataplus._M_p = (pointer)&(this->tagsAsString).field_2;
  (this->tagsAsString)._M_string_length = 0;
  (this->tagsAsString).field_2._M_local_buf[0] = '\0';
  (this->lineInfo).file._M_dataplus._M_p = (pointer)&(this->lineInfo).file.field_2;
  pcVar2 = (_lineInfo->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lineInfo,pcVar2,pcVar2 + (_lineInfo->file)._M_string_length);
  (this->lineInfo).line = _lineInfo->line;
  this->properties = None;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  p_Var5 = (_tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(_tags->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      toLower(&local_1c8,(string *)(p_Var5 + 1));
      SVar1 = this->properties;
      SVar3 = parseSpecialTag(&local_1c8);
      this->properties = SVar3 | SVar1;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->lcaseTags,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var6);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->tagsAsString,(string *)&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( std::string const& _name,
                                std::string const& _className,
                                std::string const& _description,
                                std::set<std::string> const& _tags,
                                SourceLineInfo const& _lineInfo )
    :   name( _name ),
        className( _className ),
        description( _description ),
        tags( _tags ),
        lineInfo( _lineInfo ),
        properties( None )
    {
        std::ostringstream oss;
        for( std::set<std::string>::const_iterator it = _tags.begin(), itEnd = _tags.end(); it != itEnd; ++it ) {
            oss << "[" << *it << "]";
            std::string lcaseTag = toLower( *it );
            properties = static_cast<SpecialProperties>( properties | parseSpecialTag( lcaseTag ) );
            lcaseTags.insert( lcaseTag );
        }
        tagsAsString = oss.str();
    }